

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateMethodSignatures
          (ServiceGenerator *this,VirtualOrNon virtual_or_non,Printer *printer)

{
  int iVar1;
  char *local_a8;
  allocator local_99;
  string local_98;
  undefined1 local_68 [8];
  Formatter format;
  MethodDescriptor *method;
  int i;
  Printer *printer_local;
  VirtualOrNon virtual_or_non_local;
  ServiceGenerator *this_local;
  
  method._4_4_ = 0;
  while( true ) {
    iVar1 = ServiceDescriptor::method_count(this->descriptor_);
    if (iVar1 <= method._4_4_) break;
    format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)ServiceDescriptor::method(this->descriptor_,method._4_4_);
    Formatter::Formatter((Formatter *)local_68,printer,&this->vars_);
    anon_unknown_3::InitMethodVariables
              ((MethodDescriptor *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
               this->options_,(Formatter *)local_68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,"virtual",&local_99);
    local_a8 = "";
    if (virtual_or_non == VIRTUAL) {
      local_a8 = "virtual ";
    }
    Formatter::Set<char_const*>((Formatter *)local_68,&local_98,&local_a8);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    Formatter::operator()<>
              ((Formatter *)local_68,
               "$virtual$void $name$(::$proto_ns$::RpcController* controller,\n                     const $input_type$* request,\n                     $output_type$* response,\n                     ::google::protobuf::Closure* done);\n"
              );
    Formatter::~Formatter((Formatter *)local_68);
    method._4_4_ = method._4_4_ + 1;
  }
  return;
}

Assistant:

void ServiceGenerator::GenerateMethodSignatures(VirtualOrNon virtual_or_non,
                                                io::Printer* printer) {
  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    Formatter format(printer, vars_);
    InitMethodVariables(method, options_, &format);
    format.Set("virtual", virtual_or_non == VIRTUAL ? "virtual " : "");
    format(
        "$virtual$void $name$(::$proto_ns$::RpcController* controller,\n"
        "                     const $input_type$* request,\n"
        "                     $output_type$* response,\n"
        "                     ::google::protobuf::Closure* done);\n");
  }
}